

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffd2f(double dval,int decim,char *cval,int *status)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar1 = *status;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  *cval = '\0';
  if (decim < 0) {
    ffpmsg("Error in ffd2f:  no. of decimal places < 0");
    *status = 0x19b;
    iVar2 = 0x19b;
  }
  else {
    iVar2 = snprintf(cval,0x47,"%.*f",decim,in_R8,in_R9,(ulong)uVar1);
    if (iVar2 < 0) {
      ffpmsg("Error in ffd2f converting double to string");
      *status = 0x192;
    }
    pcVar3 = strchr(cval,0x2c);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '.';
    }
    pcVar3 = strchr(cval,0x4e);
    if (pcVar3 != (char *)0x0) {
      ffpmsg("Error in ffd2f: double value is a NaN or INDEF");
      *status = 0x192;
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffd2f(double dval,  /* I - value to be converted to a string */
          int decim,    /* I - number of decimal places to display */
          char *cval,   /* O - character string representation of the value */
          int *status)  /* IO - error status */
/*
  convert double value to a null-terminated F format string
*/
{
    char *cptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    cval[0] = '\0';

    if (decim < 0)
    {
        ffpmsg("Error in ffd2f:  no. of decimal places < 0");
        return(*status = BAD_DECIM);
    }

    if (snprintf(cval, FLEN_VALUE,"%.*f", decim, dval) < 0)
    {
        ffpmsg("Error in ffd2f converting double to string");
        *status = BAD_F2C;
    }

    /* replace comma with a period (e.g. in French locale) */
    if ( (cptr = strchr(cval, ','))) *cptr = '.';

    /* test if output string is 'NaN', 'INDEF', or 'INF' */
    if (strchr(cval, 'N'))
    {
        ffpmsg("Error in ffd2f: double value is a NaN or INDEF");
        *status = BAD_F2C;
    }

    return(*status);
}